

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O1

int mapHills(Layer *l,int *out,int x,int z,int w,int h)

{
  char cVar1;
  int id;
  int id1;
  uint64_t uVar2;
  uint64_t uVar3;
  PerlinNoise *noise;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  double dVar19;
  int *local_d0;
  int *local_c0;
  long local_a8;
  int *local_78;
  
  if (l->p2 == (Layer *)0x0) {
    mapHills_cold_1();
    if (l->p2 != (Layer *)0x0) {
      iVar4 = (*l->p->getMap)(l->p,out,extraout_EDX,z,w,h);
      if (iVar4 == 0) {
        lVar18 = (long)h * (long)w;
        cVar1 = l->mc;
        iVar4 = (*l->p2->getMap)(l->p2,out + lVar18,extraout_EDX,z,w,h);
        if (iVar4 == 0) {
          if (0 < lVar18) {
            lVar16 = 0;
            do {
              uVar17 = out[lVar16];
              uVar7 = uVar17;
              if ((((out + lVar18)[lVar16] == 7) && (uVar17 != 0)) &&
                 (((cVar1 < '\n' || (iVar4 = isOceanic(uVar17), iVar4 == 0)) &&
                  (uVar7 = 0xb, uVar17 != 0xc)))) {
                uVar7 = (uint)((uVar17 & 0xfffffffe) == 0xe) * 8 + 7;
              }
              out[lVar16] = uVar7;
              lVar16 = lVar16 + 1;
            } while (lVar18 - lVar16 != 0);
          }
          iVar4 = 0;
        }
      }
      return iVar4;
    }
    mapRiverMix_cold_1();
    if (0 < h) {
      noise = (PerlinNoise *)l->noise;
      lVar18 = 0;
      do {
        if (0 < w) {
          lVar16 = 0;
          do {
            dVar19 = samplePerlin(noise,(double)(lVar16 + extraout_EDX_00) * 0.125,
                                  (double)(z + lVar18) * 0.125,0.0,0.0,0.0);
            iVar4 = 0x2c;
            if ((((dVar19 <= 0.4) && (iVar4 = 0x2d, dVar19 <= 0.2)) && (iVar4 = 10, -0.4 <= dVar19))
               && (iVar4 = 0, dVar19 < -0.2)) {
              iVar4 = 0x2e;
            }
            out[lVar18 * w + lVar16] = iVar4;
            lVar16 = lVar16 + 1;
          } while (w != lVar16);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != h);
    }
    return 0;
  }
  iVar12 = w + 2;
  iVar15 = h + 2;
  iVar4 = (*l->p->getMap)(l->p,out,x + -1,z + -1,iVar12,iVar15);
  if (iVar4 == 0) {
    lVar18 = (long)iVar12;
    iVar4 = (*l->p2->getMap)(l->p2,out + iVar15 * lVar18,x + -1,z + -1,iVar12,iVar15);
    if (iVar4 == 0) {
      if (0 < h) {
        cVar1 = l->mc;
        iVar12 = (int)cVar1;
        uVar2 = l->startSalt;
        uVar3 = l->startSeed;
        iVar4 = 3;
        if ('\t' < cVar1) {
          iVar4 = 0x22;
        }
        local_a8 = 0;
        iVar14 = 0x18;
        if (cVar1 < '\n') {
          iVar14 = 0;
        }
        local_78 = out + lVar18 * 2 + 1;
        lVar16 = (long)out + ((long)iVar15 * 4 + 4) * lVar18 + 4;
        local_c0 = out + lVar18 + 2;
        local_d0 = out;
        do {
          if (0 < w) {
            lVar8 = (long)(z + (int)local_a8);
            lVar13 = 0;
            do {
              iVar15 = *(int *)(lVar16 + lVar13 * 4);
              iVar10 = -1;
              if ('\t' < cVar1) {
                iVar10 = (int)((ulong)((long)(iVar15 + -2) * -0x72c234f7) >> 0x20) + iVar15 + -2;
                iVar10 = iVar15 + -2 + ((iVar10 >> 4) - (iVar10 >> 0x1f)) * -0x1d;
              }
              id = local_c0[lVar13 + -1];
              if ((iVar15 < 2 || iVar10 != 1) || (iVar15 = isShallowOcean(id), iVar15 != 0)) {
                lVar9 = (long)(x + (int)lVar13);
                lVar11 = uVar3 + lVar9;
                lVar11 = (lVar11 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar11 + lVar8;
                lVar9 = (lVar11 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar11 + lVar9;
                lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + lVar8;
                if ((iVar10 != 0) &&
                   (0x5555555555555554 < (lVar9 >> 0x18) * -0x5555555555555555 + 0x2aaaaaaaaaaaaaaaU
                   )) goto LAB_0011c28b;
                switch(id) {
                case 0:
                  iVar15 = iVar14;
                  break;
                case 1:
                  iVar15 = 4;
                  if (('\t' < cVar1) &&
                     (iVar15 = 4,
                     ((long)((lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + uVar2) >>
                     0x18) * -0x5555555555555555 + 0x2aaaaaaaaaaaaaaaU < 0x5555555555555555)) {
                    iVar15 = 0x12;
                  }
                  break;
                case 2:
                  iVar15 = 0x11;
                  break;
                case 3:
                  iVar15 = iVar4;
                  break;
                case 4:
                  iVar15 = 0x12;
                  break;
                case 5:
                  iVar15 = 0x13;
                  break;
                case 6:
                case 7:
                case 8:
                case 9:
                case 10:
                case 0xb:
switchD_0011c2b0_caseD_6:
                  iVar6 = areSimilar(iVar12,id,0x26);
                  iVar15 = 0x25;
                  if (((iVar6 == 0) && (iVar6 = isDeepOcean(id), iVar15 = id, iVar6 != 0)) &&
                     (lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + uVar2,
                     (lVar9 >> 0x18) * -0x5555555555555555 + 0x2aaaaaaaaaaaaaaaU <
                     0x5555555555555555)) {
                    iVar15 = (int)lVar9;
                    iVar15 = ((uint)((int)uVar2 + (iVar15 * 0x957f2d + 0x167814f) * iVar15) >> 0x18
                             & 1) * 3 + 1;
                  }
                  break;
                case 0xc:
                  iVar15 = 0xd;
                  break;
                default:
                  switch(id) {
                  case 0x15:
                    iVar15 = 0x16;
                    break;
                  case 0x16:
                  case 0x17:
                  case 0x18:
                  case 0x19:
                  case 0x1a:
                  case 0x1c:
                  case 0x1f:
                  case 0x21:
                  case 0x22:
                    goto switchD_0011c2b0_caseD_6;
                  case 0x1b:
                    iVar15 = 0x1c;
                    break;
                  case 0x1d:
                    iVar15 = 1;
                    break;
                  case 0x1e:
                    iVar15 = 0x1f;
                    break;
                  case 0x20:
                    iVar15 = 0x21;
                    break;
                  case 0x23:
                    iVar15 = 0x24;
                    break;
                  default:
                    if (id != 0xa8) goto switchD_0011c2b0_caseD_6;
                    iVar15 = 0xa9;
                  }
                }
                if (((iVar10 == 0) && (iVar15 != id)) &&
                   (iVar15 = getMutated(iVar12,iVar15), iVar15 < 0)) {
                  iVar15 = id;
                }
                if (iVar15 == id) {
                  local_d0[lVar13] = id;
                }
                else {
                  iVar10 = local_c0[lVar13 + -2];
                  iVar6 = local_c0[lVar13];
                  id1 = local_78[lVar13];
                  iVar5 = areSimilar(iVar12,out[lVar13 + 1],id);
                  iVar6 = areSimilar(iVar12,iVar6,id);
                  uVar17 = (iVar5 != 0) + 1;
                  if (iVar6 == 0) {
                    uVar17 = (uint)(iVar5 != 0);
                  }
                  iVar10 = areSimilar(iVar12,iVar10,id);
                  iVar6 = areSimilar(iVar12,id1,id);
                  if (((uVar17 - (iVar10 == 0)) + 2) - (uint)(iVar6 == 0) < (cVar1 < '\n') + 3) {
                    local_d0[lVar13] = id;
                  }
                  else {
                    local_d0[lVar13] = iVar15;
                  }
                }
              }
              else {
                iVar15 = getMutated(iVar12,id);
                if (iVar15 < 1) {
LAB_0011c28b:
                  local_d0[lVar13] = id;
                }
                else {
                  local_d0[lVar13] = iVar15;
                }
              }
              lVar13 = lVar13 + 1;
            } while (w != lVar13);
          }
          local_a8 = local_a8 + 1;
          local_d0 = local_d0 + w;
          local_78 = local_78 + lVar18;
          out = out + lVar18;
          lVar16 = lVar16 + lVar18 * 4;
          local_c0 = local_c0 + lVar18;
        } while (local_a8 != h);
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int mapHills(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    if unlikely(l->p2 == NULL)
    {
        printf("mapHills() requires two parents! Use setupMultiLayer()\n");
        exit(1);
    }